

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChHexahedronFace.h
# Opt level: O2

void __thiscall
chrono::fea::ChHexahedronFace::ComputeNF
          (ChHexahedronFace *this,double U,double V,ChVectorDynamic<> *Qi,double *detJ,
          ChVectorDynamic<> *F,ChVectorDynamic<> *state_x,ChVectorDynamic<> *state_w)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  Scalar *scalar;
  Index start;
  int i_00;
  int i;
  long index;
  double dVar4;
  double dVar5;
  ChVectorN<double,_4> N;
  ChVector<double> v_1;
  ChVector<double> v;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [16];
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [16];
  undefined1 local_190 [16];
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  element_type *local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  double local_150;
  double local_148;
  VectorBlock<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> local_138;
  ChVector<double> local_100 [2];
  undefined1 local_c0 [144];
  
  local_148 = (1.0 - U) * 0.25;
  local_150 = (U + 1.0) * 0.25;
  local_160 = (element_type *)(local_148 * (1.0 - V));
  local_158._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_150 * (1.0 - V));
  local_150 = local_150 * (V + 1.0);
  local_148 = local_148 * (V + 1.0);
  i_00 = (int)this;
  GetNodeN((ChHexahedronFace *)&local_138,i_00);
  GetNodeN((ChHexahedronFace *)local_170,i_00);
  auVar2 = vsubpd_avx(*(undefined1 (*) [16])
                       ((long)local_138.
                              super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                              super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                              .
                              super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                              .
                              super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                              .m_data + 0x20),*(undefined1 (*) [16])(local_170._0_8_ + 0x20));
  dVar5 = *(double *)
           ((long)local_138.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                  super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                  .super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                  .
                  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                  .m_data + 0x30);
  dVar1 = *(double *)(local_170._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_180,i_00);
  GetNodeN((ChHexahedronFace *)local_190,i_00);
  local_c0._16_8_ =
       (dVar5 - dVar1) - (*(double *)(local_180._0_8_ + 0x30) - *(double *)(local_190._0_8_ + 0x30))
  ;
  auVar3 = vsubpd_avx(*(undefined1 (*) [16])(local_180._0_8_ + 0x20),
                      *(undefined1 (*) [16])(local_190._0_8_ + 0x20));
  local_c0._0_16_ = vsubpd_avx(auVar2,auVar3);
  dVar4 = ChVector<double>::Length((ChVector<double> *)local_c0);
  GetNodeN((ChHexahedronFace *)local_1a0,i_00);
  GetNodeN((ChHexahedronFace *)local_1b0,i_00);
  auVar2 = vsubpd_avx(*(undefined1 (*) [16])(local_1a0._0_8_ + 0x20),
                      *(undefined1 (*) [16])(local_1b0._0_8_ + 0x20));
  dVar5 = *(double *)(local_1a0._0_8_ + 0x30);
  dVar1 = *(double *)(local_1b0._0_8_ + 0x30);
  GetNodeN((ChHexahedronFace *)local_1c0,i_00);
  GetNodeN((ChHexahedronFace *)local_1d0,i_00);
  local_100[0].m_data[2] =
       (dVar5 - dVar1) - (*(double *)(local_1c0._0_8_ + 0x30) - *(double *)(local_1d0._0_8_ + 0x30))
  ;
  auVar3 = vsubpd_avx(*(undefined1 (*) [16])(local_1c0._0_8_ + 0x20),
                      *(undefined1 (*) [16])(local_1d0._0_8_ + 0x20));
  local_100[0].m_data._0_16_ = vsubpd_avx(auVar2,auVar3);
  dVar5 = ChVector<double>::Length(local_100);
  *detJ = dVar5 * dVar4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1d0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1a0 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_190 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_180 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_170 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             ((long)&local_138.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
                     super_BlockImpl<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
                     .
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                     .
                     super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
             + 8));
  start = 0;
  for (index = 0; index != 4; index = index + 1) {
    scalar = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)&local_160,index
                       );
    Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_100,F,0,3);
    Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)local_c0,scalar,(StorageBaseType *)local_100);
    Eigen::VectorBlock<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
              (&local_138,Qi,start,3);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>const>>
              (&local_138.super_Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)local_c0);
    start = start + 3;
  }
  return;
}

Assistant:

virtual void ComputeNF(const double U,              ///< parametric coordinate in surface
                           const double V,              ///< parametric coordinate in surface
                           ChVectorDynamic<>& Qi,       ///< result of N'*F, maybe with offset block_offset
                           double& detJ,                ///< det[J]
                           const ChVectorDynamic<>& F,  ///< Input F vector, size is = n.field coords.
                           ChVectorDynamic<>* state_x,  ///< if != 0, update state (pos. part) to this, then evaluate Q
                           ChVectorDynamic<>* state_w   ///< if != 0, update state (speed part) to this, then evaluate Q
                           ) override {
        ChVectorN<double, 4> N;
        ShapeFunctions(N, U, V);

        //***TODO*** exact det of jacobian at u,v
        detJ = ((GetNodeN(0)->GetPos() - GetNodeN(1)->GetPos()) - (GetNodeN(2)->GetPos() - GetNodeN(3)->GetPos()))
                   .Length() *
               ((GetNodeN(1)->GetPos() - GetNodeN(2)->GetPos()) - (GetNodeN(3)->GetPos() - GetNodeN(0)->GetPos()))
                   .Length();
        // (approximate detJ, ok only for rectangular face)

        for (int i = 0; i < 4; i++) {
            Qi.segment(3 * i, 3) = N(i) * F.segment(0, 3);
        }
    }